

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kaitaistream.cpp
# Opt level: O0

string * kaitai::kstream::bytes_strip_right
                   (string *__return_storage_ptr__,string *src,char pad_byte)

{
  char *pcVar1;
  bool bVar2;
  undefined8 local_28;
  size_t new_len;
  char pad_byte_local;
  string *src_local;
  
  local_28 = std::__cxx11::string::length();
  while( true ) {
    bVar2 = false;
    if (local_28 != 0) {
      pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)src);
      bVar2 = *pcVar1 == pad_byte;
    }
    if (!bVar2) break;
    local_28 = local_28 + -1;
  }
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)src);
  return __return_storage_ptr__;
}

Assistant:

std::string kaitai::kstream::bytes_strip_right(std::string src, char pad_byte) {
    std::size_t new_len = src.length();

    while (new_len > 0 && src[new_len - 1] == pad_byte)
        new_len--;

    return src.substr(0, new_len);
}